

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O0

SegmentAnd<capnp::Text::Builder> *
capnp::_::WireHelpers::initTextPointer
          (SegmentAnd<capnp::Text::Builder> *__return_storage_ptr__,WirePointer *ref,
          SegmentBuilder *segment,CapTableBuilder *capTable,TextSize size,BuilderArena *orphanArena)

{
  WordCount amount;
  uint uVar1;
  word *value;
  word *ptr;
  uint byteSize;
  BuilderArena *orphanArena_local;
  TextSize size_local;
  CapTableBuilder *capTable_local;
  SegmentBuilder *segment_local;
  WirePointer *ref_local;
  
  capTable_local = (CapTableBuilder *)segment;
  segment_local = (SegmentBuilder *)ref;
  amount = roundBytesUpToWords(size + 1);
  value = allocate((WirePointer **)&segment_local,(SegmentBuilder **)&capTable_local,capTable,amount
                   ,LIST,orphanArena);
  WirePointer::ListRef::set
            ((ListRef *)((long)&(segment_local->super_SegmentReader).arena + 4),BYTE,size + 1);
  __return_storage_ptr__->segment = (SegmentBuilder *)capTable_local;
  uVar1 = unbound<unsigned_int>(size);
  Text::Builder::Builder(&__return_storage_ptr__->value,(char *)value,(ulong)uVar1);
  return __return_storage_ptr__;
}

Assistant:

static KJ_ALWAYS_INLINE(SegmentAnd<Text::Builder> initTextPointer(
      WirePointer* ref, SegmentBuilder* segment, CapTableBuilder* capTable, TextSize size,
      BuilderArena* orphanArena = nullptr)) {
    // The byte list must include a NUL terminator.
    auto byteSize = size + ONE * BYTES;

    // Allocate the space.
    word* ptr = allocate(
        ref, segment, capTable, roundBytesUpToWords(byteSize), WirePointer::LIST, orphanArena);

    // Initialize the pointer.
    ref->listRef.set(ElementSize::BYTE, byteSize * (ONE * ELEMENTS / BYTES));

    // Build the Text::Builder. Note that since allocate()ed memory is pre-zero'd, we don't need
    // to initialize the NUL terminator.
    return { segment, Text::Builder(reinterpret_cast<char*>(ptr), unbound(size / BYTES)) };
  }